

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O0

void __thiscall nuraft::srv_state::inc_term(srv_state *this)

{
  bool bVar1;
  __atomic_base<unsigned_long> *this_00;
  __atomic_base<unsigned_long> *in_RDI;
  ulong new_term;
  unsigned_long in_stack_ffffffffffffffd8;
  function<unsigned_long_(unsigned_long)> *in_stack_ffffffffffffffe0;
  function<unsigned_long_(unsigned_long)> *this_01;
  
  bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffffe0);
  if (bVar1) {
    this_01 = (function<unsigned_long_(unsigned_long)> *)(in_RDI + 3);
    std::__atomic_base::operator_cast_to_unsigned_long(in_RDI);
    this_00 = (__atomic_base<unsigned_long> *)
              std::function<unsigned_long_(unsigned_long)>::operator()
                        (this_01,in_stack_ffffffffffffffd8);
    std::__atomic_base<unsigned_long>::operator=(this_00,(__int_type_conflict)in_RDI);
  }
  else {
    std::__atomic_base<unsigned_long>::operator++(in_RDI + 1,0);
  }
  return;
}

Assistant:

void inc_term() {
        if (inc_term_cb_) {
            ulong new_term = inc_term_cb_(term_);
            assert(new_term > term_);
            term_ = new_term;
            return;
        }
        term_++;
    }